

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O2

spv_result_t spvtools::val::AnnotationPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  pointer ppVar2;
  pointer puVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var4;
  bool bVar5;
  uint16_t uVar6;
  Decoration DVar7;
  uint uVar8;
  uint uVar9;
  FPFastMathModeMask FVar10;
  int32_t iVar11;
  BuiltIn BVar12;
  StorageClass SVar13;
  Instruction *pIVar14;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar15;
  Instruction *this;
  size_t i;
  pointer ppVar16;
  ulong uVar17;
  char *pcVar18;
  Op opcode;
  size_t index;
  anon_class_32_4_2877ff2f fail;
  undefined1 local_248 [32];
  uint local_228;
  spv_result_t local_78;
  string local_70;
  string local_50;
  
  uVar6 = (inst->inst_).opcode;
  switch(uVar6) {
  case 0x47:
    DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar8);
    if (pIVar14 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "target is not defined";
      goto LAB_0054c122;
    }
    bVar5 = spvIsVulkanEnv(_->context_->target_env);
    if (((DVar7 & ~DecorationSpecId) == DecorationGLSLShared) && (bVar5)) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&fail,_,0x123d,(char *)0x0);
      std::operator<<((ostream *)local_248,(string *)&fail);
      std::operator<<((ostream *)local_248,"OpDecorate decoration \'");
      ValidationState_t::SpvDecorationString_abi_cxx11_(&local_70,_,DVar7);
      std::operator<<((ostream *)local_248,(string *)&local_70);
      std::operator<<((ostream *)local_248,"\' is not valid for the Vulkan execution environment.");
      std::__cxx11::string::_M_dispose();
      goto LAB_0054be36;
    }
    if (DVar7 == DecorationNoContraction) {
      bVar5 = ValidationState_t::HasDecoration(_,uVar8,DecorationFPFastMathMode);
      if (bVar5) {
LAB_0054c0d7:
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "FPFastMathMode and NoContraction cannot decorate the same target";
        goto LAB_0054c122;
      }
    }
    else if (DVar7 == DecorationFPFastMathMode) {
      bVar5 = ValidationState_t::HasDecoration(_,uVar8,DecorationNoContraction);
      if (bVar5) goto LAB_0054c0d7;
      FVar10 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(inst,2);
      if ((~FVar10 & 0x30000) != 0 && (FVar10 >> 0x12 & 1) != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar18 = 
        "AllowReassoc and AllowContract must be specified when AllowTransform is specified";
        goto LAB_0054c122;
      }
    }
    bVar5 = anon_unknown_3::DecorationTakesIdParameters(DVar7);
    if (bVar5) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "Decorations taking ID parameters may not be used with OpDecorateId";
      goto LAB_0054c122;
    }
    uVar1 = (pIVar14->inst_).opcode;
    if (uVar1 == 0x49) break;
    if ((DVar7 < DecorationGLSLShared) && ((0xb0U >> (DVar7 & Component) & 1) != 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::SpvDecorationString_abi_cxx11_((string *)&fail,_,DVar7);
      std::operator<<((ostream *)local_248,(string *)&fail);
      std::operator<<((ostream *)local_248," can only be applied to structure members");
      goto LAB_0054be36;
    }
    fail.dec = DVar7;
    opcode = (Op)uVar1;
    fail._ = _;
    fail.inst = inst;
    fail.target = pIVar14;
    switch(DVar7) {
    case DecorationSpecId:
      bVar5 = spvOpcodeIsScalarSpecConstant((uint)uVar1);
      if (!bVar5) {
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be a scalar specialization constant";
        goto LAB_0054c122;
      }
      break;
    case Block:
    case BufferBlock:
    case DecorationGLSLShared:
    case DecorationGLSLPacked:
    case CPacked:
      if (opcode != OpTypeStruct) {
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be a structure type";
        goto LAB_0054c122;
      }
      break;
    case DecorationRowMajor:
    case ColMajor:
    case DecorationMatrixStride:
    case DecorationGLSLShared|DecorationRowMajor:
    case DecorationUniform:
    case DecorationUniformId:
    case DecorationSaturatedConversion:
    case DecorationOffset:
    case DecorationFuncParamAttr:
    case DecorationFPRoundingMode:
    case DecorationFPFastMathMode:
    case DecorationLinkageAttributes:
    case DecorationNoContraction:
      break;
    case ArrayStride:
      if (((OpTypePointer < opcode) || ((0x130000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
         (opcode != OpTypeUntypedPointerKHR)) {
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be an array or pointer type";
        goto LAB_0054c122;
      }
      break;
    case BuiltIn:
      if (((opcode != OpVariable) && (opcode != OpUntypedVariableKHR)) &&
         (iVar11 = spvOpcodeIsConstant(opcode), iVar11 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar18 = "BuiltIns can only target variables, structure members or constants";
        goto LAB_0054c122;
      }
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if ((bVar5) &&
         (BVar12 = Instruction::GetOperandAs<spv::BuiltIn>(inst,2), BVar12 == BuiltInWorkgroupSize))
      {
        iVar11 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode);
        if (iVar11 == 0) {
          anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                    ((DiagnosticStream *)local_248,&fail,0);
          pcVar18 = "must be a constant for WorkgroupSize";
          goto LAB_0054c122;
        }
      }
      else {
        uVar6 = (pIVar14->inst_).opcode;
        if ((uVar6 != 0x3b) && (uVar6 != 0x1142)) goto LAB_0054c435;
      }
      break;
    case DecorationNoPerspective:
    case DecorationFlat:
    case DecorationPatch:
    case Centroid:
    case DecorationSample:
    case DecorationRestrict:
    case Aliased:
    case DecorationVolatile:
    case Coherent:
    case DecorationNonWritable:
    case DecorationNonReadable:
    case DecorationStream:
    case Component:
    case DecorationXfbBuffer:
    case DecorationXfbStride:
switchD_0054c3cb_caseD_d:
      if ((((uVar1 == OpFunctionParameter) || (opcode == OpVariable)) ||
          (opcode == OpUntypedVariableKHR)) || (opcode == OpRawAccessChainNV)) {
        bVar5 = ValidationState_t::IsPointerType(_,(pIVar14->inst_).type_id);
        if (bVar5) break;
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be a pointer type";
      }
      else {
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be a memory object declaration";
      }
      goto LAB_0054c122;
    case DecorationInvariant:
    case Constant:
    case DecorationLocation:
    case DecorationIndex:
    case Binding:
    case DecorationDescriptorSet:
    case DecorationInputAttachmentIndex:
      if ((uVar1 != 0x3b) && (opcode != OpUntypedVariableKHR)) {
LAB_0054c435:
        anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  ((DiagnosticStream *)local_248,&fail,0);
        pcVar18 = "must be a variable";
        goto LAB_0054c122;
      }
      break;
    default:
      if ((DVar7 - DecorationRestrictPointer < 2) || (DVar7 == DecorationPerPrimitiveEXT))
      goto switchD_0054c3cb_caseD_d;
    }
    bVar5 = spvIsVulkanEnv(_->context_->target_env);
    if (bVar5) {
      this = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
      SVar13 = StorageClassUniform;
      if ((this != (Instruction *)0x0) &&
         (0x20 < (ulong)((long)(this->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        SVar13 = Instruction::GetOperandAs<spv::StorageClass>(this,1);
      }
      switch(DVar7) {
      case DecorationNoPerspective:
      case DecorationFlat:
      case Centroid:
      case DecorationSample:
        if ((SVar13 & ~StorageClassUniform) != Input) {
          anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                    ((DiagnosticStream *)local_248,&fail,0x123e);
          pcVar18 = "storage class must be Input or Output";
LAB_0054c122:
          std::operator<<((ostream *)local_248,pcVar18);
          goto LAB_0054c134;
        }
        break;
      case DecorationPatch:
      case DecorationInvariant:
      case DecorationRestrict:
      case Aliased:
      case DecorationVolatile:
      case Constant:
      case Coherent:
      case DecorationNonWritable:
      case DecorationNonReadable:
      case DecorationUniform:
      case DecorationUniformId:
      case DecorationSaturatedConversion:
      case DecorationStream:
        break;
      case DecorationLocation:
      case Component:
        if ((((0x39 < SVar13 - CallableDataKHR) ||
             ((0x20000000000cc03U >> ((ulong)(SVar13 - CallableDataKHR) & 0x3f) & 1) == 0)) &&
            (SVar13 != Input)) && ((SVar13 != Output && (SVar13 != StorageClassTileImageEXT)))) {
          ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,pIVar14);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_70,_,0x1a10,(char *)0x0);
          std::operator<<((ostream *)local_248,(string *)&local_70);
          ValidationState_t::SpvDecorationString_abi_cxx11_(&local_50,_,DVar7);
          std::operator<<((ostream *)local_248,(string *)&local_50);
          std::operator<<((ostream *)local_248,
                          " decoration must not be applied to this storage class");
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0054c134;
        }
        break;
      case DecorationIndex:
        if (SVar13 != Output) {
          anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                    ((DiagnosticStream *)local_248,&fail,0);
          pcVar18 = "must be in the Output storage class";
          goto LAB_0054c122;
        }
        break;
      case Binding:
      case DecorationDescriptorSet:
        if ((StorageBuffer < SVar13) || ((0x1005U >> (SVar13 & 0x1f) & 1) == 0)) {
          anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                    ((DiagnosticStream *)local_248,&fail,0x195b);
          pcVar18 = "must be in the StorageBuffer, Uniform, or UniformConstant storage class";
          goto LAB_0054c122;
        }
        break;
      default:
        if (DVar7 == DecorationInputAttachmentIndex) {
          if (SVar13 != StorageClassUniformConstant) {
            anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                      ((DiagnosticStream *)local_248,&fail,0x1a16);
            pcVar18 = "must be in the UniformConstant storage class";
            goto LAB_0054c122;
          }
        }
        else if ((DVar7 == DecorationPerVertexKHR) && (SVar13 != Input)) {
          anon_unknown_3::ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                    ((DiagnosticStream *)local_248,&fail,0x1a79);
          pcVar18 = "storage class must be Input";
          goto LAB_0054c122;
        }
      }
    }
    break;
  case 0x48:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x1e)) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpMemberDecorate Structure type <id> ";
LAB_0054beca:
      std::operator<<((ostream *)local_248,pcVar18);
      ValidationState_t::getIdName_abi_cxx11_((string *)&fail,_,uVar8);
      std::operator<<((ostream *)local_248,(string *)&fail);
      pcVar18 = " is not a struct type.";
LAB_0054bef6:
      std::operator<<((ostream *)local_248,pcVar18);
      goto LAB_0054bf08;
    }
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    if ((int)((ulong)((long)(pIVar14->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pIVar14->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - 2U <= uVar9) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_248,"Index ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_248);
      std::operator<<((ostream *)local_248," provided in OpMemberDecorate for struct <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&fail,_,uVar8);
      std::operator<<((ostream *)local_248,(string *)&fail);
      std::operator<<((ostream *)local_248," is out of bounds. The structure has ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_248);
      std::operator<<((ostream *)local_248," members. Largest valid index is ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_248);
      std::operator<<((ostream *)local_248,".");
      goto LAB_0054bf08;
    }
    DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,2);
    if ((((DVar7 < (DecorationIndex|Centroid)) &&
         ((0xffc71c50074eU >> ((ulong)DVar7 & 0x3f) & 1) != 0)) ||
        ((DVar7 - DecorationNonUniform < 0x39 &&
         ((0x180000000000001U >> ((ulong)(DVar7 - DecorationNonUniform) & 0x3f) & 1) != 0)))) ||
       ((DVar7 - DecorationNoSignedWrap < 2 || (DVar7 == CounterBuffer)))) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::SpvDecorationString_abi_cxx11_((string *)&fail,_,DVar7);
      std::operator<<((ostream *)local_248,(string *)&fail);
      pcVar18 = " cannot be applied to structure members";
      goto LAB_0054be1e;
    }
    break;
  case 0x49:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar8);
    ppVar2 = (pIVar14->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar16 = (pIVar14->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar2;
        ppVar16 = ppVar16 + 1) {
      uVar1 = (ppVar16->first->inst_).opcode;
      if ((((4 < uVar1 - 0x47) || ((0x19U >> (uVar1 - 0x47 & 0x1f) & 1) == 0)) && (uVar1 != 5)) &&
         ((uVar1 != 0x14c && (bVar5 = Instruction::IsNonSemantic(ppVar16->first), !bVar5)))) {
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_248,"Result id of OpDecorationGroup can only ");
        std::operator<<((ostream *)local_248,"be targeted by OpName, OpGroupDecorate, ");
        pcVar18 = "OpDecorate, OpDecorateId, and OpGroupMemberDecorate";
        goto LAB_0054c122;
      }
    }
    break;
  case 0x4a:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupDecorate Decoration group <id> ";
LAB_0054be7f:
      std::operator<<((ostream *)local_248,pcVar18);
      ValidationState_t::getIdName_abi_cxx11_((string *)&fail,_,uVar8);
      std::operator<<((ostream *)local_248,(string *)&fail);
      pcVar18 = " is not a decoration group.";
      goto LAB_0054bef6;
    }
    uVar17 = 1;
    do {
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar17)
      goto switchD_0054c60b_caseD_f;
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,uVar17);
      pIVar14 = ValidationState_t::FindDef(_,uVar8);
    } while ((pIVar14 != (Instruction *)0x0) &&
            (uVar17 = (ulong)((int)uVar17 + 1), (pIVar14->inst_).opcode != 0x49));
    ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_248,"OpGroupDecorate may not target OpDecorationGroup <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&fail,_,uVar8);
    std::operator<<((ostream *)local_248,(string *)&fail);
LAB_0054bf08:
    std::__cxx11::string::_M_dispose();
    goto LAB_0054c134;
  case 0x4b:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupMemberDecorate Decoration group <id> ";
      goto LAB_0054be7f;
    }
    index = 1;
    do {
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= index + 1)
      goto switchD_0054c60b_caseD_f;
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,index);
      uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,index + 1);
      pIVar14 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x1e)) {
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "OpGroupMemberDecorate Structure type <id> ";
        goto LAB_0054beca;
      }
      index = index + 2;
    } while (uVar9 < (int)((ulong)((long)(pIVar14->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pIVar14->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) - 2U);
    ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_248,"Index ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_248);
    std::operator<<((ostream *)local_248," provided in OpGroupMemberDecorate for struct <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&fail,_,uVar8);
    std::operator<<((ostream *)local_248,(string *)&fail);
    std::operator<<((ostream *)local_248," is out of bounds. The structure has ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_248);
    std::operator<<((ostream *)local_248," members. Largest valid index is ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_248);
    pcVar18 = ".";
LAB_0054be1e:
    std::operator<<((ostream *)local_248,pcVar18);
LAB_0054be36:
    std::__cxx11::string::_M_dispose();
LAB_0054c134:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_248);
    if (local_78 != SPV_SUCCESS) {
      return local_78;
    }
    break;
  default:
    if (uVar6 == 0x14c) {
      DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
      bVar5 = anon_unknown_3::DecorationTakesIdParameters(DVar7);
      if (!bVar5) {
        ValidationState_t::diag((DiagnosticStream *)local_248,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "Decorations that don\'t take ID parameters may not be used with OpDecorateId";
        goto LAB_0054c122;
      }
      break;
    }
    goto LAB_0054c146;
  }
switchD_0054c60b_caseD_f:
  uVar6 = (inst->inst_).opcode;
LAB_0054c146:
  switch(uVar6) {
  case 0x48:
    puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = puVar3[1];
    uVar8 = puVar3[2];
    DVar7 = puVar3[3];
    fail._ = (ValidationState_t *)0x0;
    fail.dec = DecorationRelaxedPrecision;
    fail._12_4_ = 0;
    fail.inst = (Instruction *)0x0;
    _Var4._M_current =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (0x10 < (ulong)((long)_Var4._M_current - (long)puVar3)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&fail,(const_iterator)0x0,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar3 + 4),_Var4);
    }
    local_248._0_4_ = DVar7;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_248 + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fail);
    local_228 = uVar8;
LAB_0054c21b:
    ValidationState_t::RegisterDecorationForId(_,uVar9,(Decoration *)local_248);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_248 + 8));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&fail);
    break;
  case 0x49:
    break;
  case 0x4a:
    psVar15 = ValidationState_t::id_decorations
                        (_,(inst->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]);
    for (uVar17 = 2;
        puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
        uVar17 = uVar17 + 1) {
      ValidationState_t::
      RegisterDecorationsForId<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (_,puVar3[uVar17],(psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(psVar15->_M_t)._M_impl.super__Rb_tree_header);
    }
    break;
  case 0x4b:
    psVar15 = ValidationState_t::id_decorations
                        (_,(inst->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]);
    for (uVar17 = 3;
        puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
        uVar17 = uVar17 + 2) {
      ValidationState_t::
      RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (_,puVar3[uVar17 - 1],puVar3[uVar17],
                 (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(psVar15->_M_t)._M_impl.super__Rb_tree_header);
    }
    break;
  default:
    if (uVar6 != 0x14c) {
      return SPV_SUCCESS;
    }
  case 0x47:
    puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = puVar3[1];
    DVar7 = puVar3[2];
    fail._ = (ValidationState_t *)0x0;
    fail.dec = DecorationRelaxedPrecision;
    fail._12_4_ = 0;
    fail.inst = (Instruction *)0x0;
    _Var4._M_current =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (0xc < (ulong)((long)_Var4._M_current - (long)puVar3)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&fail,(const_iterator)0x0,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar3 + 3),_Var4);
    }
    local_248._0_4_ = DVar7;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_248 + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fail);
    local_228 = 0xffffffff;
    goto LAB_0054c21b;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t AnnotationPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
      if (auto error = ValidateDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorateId:
      if (auto error = ValidateDecorateId(_, inst)) return error;
      break;
    // TODO(dneto): spv::Op::OpDecorateStringGOOGLE
    // See https://github.com/KhronosGroup/SPIRV-Tools/issues/2253
    case spv::Op::OpMemberDecorate:
      if (auto error = ValidateMemberDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorationGroup:
      if (auto error = ValidateDecorationGroup(_, inst)) return error;
      break;
    case spv::Op::OpGroupDecorate:
      if (auto error = ValidateGroupDecorate(_, inst)) return error;
      break;
    case spv::Op::OpGroupMemberDecorate:
      if (auto error = ValidateGroupMemberDecorate(_, inst)) return error;
      break;
    default:
      break;
  }

  // In order to validate decoration rules, we need to know all the decorations
  // that are applied to any given <id>.
  RegisterDecorations(_, inst);

  return SPV_SUCCESS;
}